

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<std::unique_ptr<int,std::default_delete<int>>const&,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>const&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          unique_ptr<int,_std::default_delete<int>_> *args,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *args_1)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  undefined4 uVar2;
  int *piVar3;
  Queue *pQVar4;
  void *result;
  _Rb_tree_node_base *p_Var5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3;
  ulong local_48;
  
  piVar3 = (args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  p_Var5 = (args_1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar8 = 4;
  while ((_Rb_tree_header *)p_Var5 != &(args_1->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    lVar8 = lVar8 + 8;
  }
  local_48 = (ulong)((uint)(piVar3 != (int *)0x0) * 4 + 1);
  lVar8 = lVar8 + local_48 + 0x10;
  minQueueCapacity = lVar8 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)lVar8;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 4;
  *(uint64_t *)(pcVar7 + 4) = eventSourceId;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 8;
  *(uint64_t *)(pcVar7 + 8) = clock;
  pcVar7 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar7;
  if ((args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    *pcVar7 = '\0';
    lVar8 = 1;
  }
  else {
    *pcVar7 = '\x01';
    pcVar7 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar7 + 1;
    *(int *)(pcVar7 + 1) =
         *(args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar8 = 4;
  }
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + lVar8;
  uVar2 = (undefined4)(args_1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)(pcVar7 + lVar8) = uVar2;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 4;
  mserialize::detail::
  BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
  ::serialize_elems<binlog::detail::QueueWriter>(args_1,uVar2,this_00);
  pQVar4 = (this->_qw)._queue;
  (pQVar4->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar4->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}